

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureGatherTests.cpp
# Opt level: O0

long __thiscall glcts::anon_unknown_0::GatherBase::TestCompute(GatherBase *this)

{
  GLfloat v0;
  GLfloat v1;
  GLfloat v2;
  bool bVar1;
  GLuint GVar2;
  GLint location;
  int iVar3;
  float *pfVar4;
  undefined4 extraout_var;
  long error;
  Vector<float,_4> local_7c;
  Vector<float,_4> local_6c;
  Vector<float,_4> local_5c;
  string local_40;
  GLuint local_1c;
  GatherBase *pGStack_18;
  GLuint m_buffer;
  GatherBase *this_local;
  
  pGStack_18 = this;
  (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x1d])();
  GVar2 = TGBase::CreateComputeProgram(&this->super_TGBase,&local_40);
  this->program = GVar2;
  std::__cxx11::string::~string((string *)&local_40);
  glu::CallLogWrapper::glLinkProgram
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             this->program);
  bVar1 = TGBase::CheckProgram(&this->super_TGBase,this->program,(bool *)0x0);
  if (bVar1) {
    glu::CallLogWrapper::glUseProgram
              (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               this->program);
    location = glu::CallLogWrapper::glGetUniformLocation
                         (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.
                           super_CallLogWrapper,this->program,"cs_in");
    (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x23])(&local_5c);
    pfVar4 = tcu::Vector<float,_4>::x(&local_5c);
    v0 = *pfVar4;
    (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x23])(&local_6c);
    pfVar4 = tcu::Vector<float,_4>::y(&local_6c);
    v1 = *pfVar4;
    (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x23])(&local_7c);
    pfVar4 = tcu::Vector<float,_4>::z(&local_7c);
    v2 = *pfVar4;
    (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x23])
              ((long)&error + 4);
    pfVar4 = tcu::Vector<float,_4>::w((Vector<float,_4> *)((long)&error + 4));
    glu::CallLogWrapper::glUniform4f
              (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,location
               ,v0,v1,v2,*pfVar4);
    glu::CallLogWrapper::glGenBuffers
              (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,1,
               &local_1c);
    glu::CallLogWrapper::glBindBufferBase
              (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0x90d2,0
               ,local_1c);
    glu::CallLogWrapper::glBufferData
              (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0x90d2,
               0x10,(void *)0x0,0x88e8);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0x90d2,0
              );
    glu::CallLogWrapper::glDispatchCompute
              (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,1,1,1);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0x90d2,
               local_1c);
    glu::CallLogWrapper::glMemoryBarrier
              (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0x200);
    iVar3 = (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x26])();
    glu::CallLogWrapper::glUnmapBuffer
              (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0x90d2);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0x90d2,0
              );
    glu::CallLogWrapper::glDeleteBuffers
              (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,1,
               &local_1c);
    this_local = (GatherBase *)CONCAT44(extraout_var,iVar3);
  }
  else {
    this_local = (GatherBase *)&DAT_ffffffffffffffff;
  }
  return (long)this_local;
}

Assistant:

virtual long TestCompute()
	{
		GLuint m_buffer;

		program = CreateComputeProgram(ComputeShader());
		glLinkProgram(program);
		if (!CheckProgram(program))
			return ERROR;
		glUseProgram(program);

		glUniform4f(glGetUniformLocation(program, "cs_in"), BufferData().x(), BufferData().y(), BufferData().z(),
					BufferData().w());

		glGenBuffers(1, &m_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(Vec4), NULL, GL_DYNAMIC_DRAW);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);

		glDispatchCompute(1, 1, 1);

		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_buffer);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		long error = VerifyCompute();
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);
		glDeleteBuffers(1, &m_buffer);

		return error;
	}